

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float4x4 *
ConvexDecomposition::MatrixRotationZ(float4x4 *__return_storage_ptr__,float angle_radians)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar5 [16];
  
  fVar3 = sinf(angle_radians);
  fVar4 = cosf(angle_radians);
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = fVar3;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(auVar1,auVar2);
  (__return_storage_ptr__->x).x = fVar4;
  (__return_storage_ptr__->x).y = fVar3;
  (__return_storage_ptr__->x).z = 0.0;
  (__return_storage_ptr__->x).w = 0.0;
  (__return_storage_ptr__->y).x = auVar2._0_4_;
  (__return_storage_ptr__->y).y = fVar4;
  auVar5._0_12_ = ZEXT412(0);
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->y).z = auVar5;
  (__return_storage_ptr__->z).z = 1.0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->z).w = auVar5;
  (__return_storage_ptr__->w).w = 1.0;
  return __return_storage_ptr__;
}

Assistant:

float4x4 MatrixRotationZ(const float angle_radians)
{
	float s =  sinf(angle_radians);
	float c =  cosf(angle_radians);
	return float4x4(
		c,  s,  0,  0,
		-s, c,  0,  0,
		0,  0,  1,  0,
		0,  0,  0,  1 );
}